

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::append(QByteArray *this,QByteArray *ba)

{
  char *pcVar1;
  long lVar2;
  QByteArrayView v;
  QByteArrayView data;
  
  pcVar1 = (ba->d).ptr;
  if (pcVar1 != (char *)0x0) {
    if ((this->d).ptr == (char *)0x0) {
      if ((ba->d).d == (Data *)0x0) {
        v.m_data = pcVar1;
        v.m_size = (ba->d).size;
        assign(this,v);
      }
      else {
        QArrayDataPointer<char>::operator=(&this->d,&ba->d);
      }
    }
    else {
      lVar2 = (ba->d).size;
      if (lVar2 != 0) {
        data.m_data = pcVar1;
        data.m_size = lVar2;
        insert(this,(this->d).size,data);
      }
    }
  }
  return this;
}

Assistant:

QByteArray &QByteArray::append(const QByteArray &ba)
{
    if (!ba.isNull()) {
        if (isNull()) {
            if (Q_UNLIKELY(!ba.d.isMutable()))
                assign(ba); // fromRawData, so we do a deep copy
            else
                operator=(ba);
        } else if (ba.size()) {
            append(QByteArrayView(ba));
        }
    }
    return *this;
}